

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

file_status __thiscall
boost::filesystem::directory_entry::m_get_symlink_status(directory_entry *this,error_code *ec)

{
  bool bVar1;
  error_code *in_RDX;
  file_status local_30;
  file_status local_28;
  error_code *local_20;
  error_code *ec_local;
  directory_entry *this_local;
  
  local_20 = in_RDX;
  ec_local = ec;
  this_local = this;
  file_status::file_status(&local_28,(file_status *)&ec[2].m_cat);
  bVar1 = status_known(&local_28);
  if (bVar1) {
    if (local_20 != (error_code *)0x0) {
      system::error_code::clear(local_20);
    }
  }
  else {
    detail::symlink_status((detail *)&local_30,(path *)ec,local_20);
    file_status::operator=((file_status *)&ec[2].m_cat,&local_30);
  }
  file_status::file_status((file_status *)this,(file_status *)&ec[2].m_cat);
  return (file_status)this;
}

Assistant:

file_status
  directory_entry::m_get_symlink_status(system::error_code* ec) const
  {
    if (!status_known(m_symlink_status))
      m_symlink_status = detail::symlink_status(m_path, ec);
    else if (ec != 0) ec->clear();
    return m_symlink_status;
  }